

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandFEAT(FtpSession *this,string *param_1)

{
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *param_1_local;
  FtpSession *this_local;
  
  local_18 = param_1;
  param_1_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(local_190,"211- Feature List:\r\n");
  ::std::operator<<(local_190," UTF8\r\n");
  ::std::operator<<(local_190," SIZE\r\n");
  ::std::operator<<(local_190," LANG EN\r\n");
  ::std::operator<<(local_190,"211 END\r\n");
  ::std::__cxx11::stringstream::str();
  sendRawFtpMessage(this,local_1d0);
  ::std::__cxx11::string::~string((string *)local_1d0);
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void FtpSession::handleFtpCommandFEAT(const std::string& /*param*/)
  {
    std::stringstream ss;
    ss << "211- Feature List:\r\n";
    ss << " UTF8\r\n";
    ss << " SIZE\r\n";
    ss << " LANG EN\r\n";
    ss << "211 END\r\n";

    sendRawFtpMessage(ss.str());
  }